

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void duckdb::FirstFunctionString<false,false>::
     Operation<duckdb::string_t,duckdb::FirstState<duckdb::string_t>,duckdb::FirstFunctionString<false,false>>
               (FirstState<duckdb::string_t> *state,string_t *input,AggregateUnaryInput *unary_input
               )

{
  AggregateInputData *state_00;
  AggregateInputData *input_data;
  char *pcVar1;
  bool bVar2;
  undefined1 in_R9B;
  string_t value;
  
  if (state->is_set != false) {
    return;
  }
  state_00 = unary_input->input;
  input_data = *(AggregateInputData **)&input->value;
  pcVar1 = (input->value).pointer.ptr;
  bVar2 = AggregateUnaryInput::RowIsValid(unary_input);
  value.value.inlined.inlined[4] = !bVar2;
  value.value._0_8_ = pcVar1;
  value.value._9_7_ = 0;
  FirstFunctionStringBase<false,false>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
            ((FirstFunctionStringBase<false,false> *)state,(FirstState<duckdb::string_t> *)state_00,
             input_data,value,(bool)in_R9B);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			FirstFunctionStringBase<LAST, SKIP_NULLS>::template SetValue<STATE>(state, unary_input.input, input,
			                                                                    !unary_input.RowIsValid());
		}
	}